

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ApertureILS.cpp
# Opt level: O0

double __thiscall imrt::ApertureILS::perturbation(ApertureILS *this,Plan *P)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  iterator iVar6;
  Station *this_00;
  reference ppSVar7;
  ostream *poVar8;
  void *this_01;
  int iVar9;
  Plan *in_RSI;
  long in_RDI;
  iterator s;
  int i;
  double aux_eval;
  list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> diff;
  int aperture;
  int beamlet;
  list<imrt::Station_*,_std::allocator<imrt::Station_*>_> stations;
  list<imrt::Station_*,_std::allocator<imrt::Station_*>_> *in_stack_fffffffffffffe48;
  list<imrt::Station_*,_std::allocator<imrt::Station_*>_> *in_stack_fffffffffffffe50;
  Station *in_stack_fffffffffffffe58;
  Plan *in_stack_fffffffffffffe60;
  ostream *in_stack_fffffffffffffe68;
  ostream *in_stack_fffffffffffffe70;
  Station *in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffe88;
  undefined4 in_stack_fffffffffffffe8c;
  list<imrt::Station_*,_std::allocator<imrt::Station_*>_> *in_stack_fffffffffffffe90;
  int in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff74;
  Station *in_stack_ffffffffffffff78;
  undefined1 lside;
  int aperture_00;
  int in_stack_ffffffffffffffa4;
  Station *in_stack_ffffffffffffffa8;
  double local_50;
  undefined1 local_28 [24];
  Plan *local_10;
  
  local_10 = in_RSI;
  Plan::get_stations_abi_cxx11_(in_RSI);
  std::__cxx11::list<imrt::Station_*,_std::allocator<imrt::Station_*>_>::list
            (in_stack_fffffffffffffe90,
             (list<imrt::Station_*,_std::allocator<imrt::Station_*>_> *)
             CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
  std::__cxx11::list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::list
            ((list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)0x16cd91);
  local_50 = Plan::getEvaluation(local_10);
  std::operator<<((ostream *)&std::cout,"##  Perturbation: ");
  if (*(int *)(in_RDI + 0x58) == 0) {
    std::operator<<((ostream *)&std::cout,"none");
  }
  else {
    std::__cxx11::
    list<std::pair<imrt::Station_*,_int>,_std::allocator<std::pair<imrt::Station_*,_int>_>_>::clear
              ((list<std::pair<imrt::Station_*,_int>,_std::allocator<std::pair<imrt::Station_*,_int>_>_>
                *)in_stack_fffffffffffffe50);
  }
  for (aperture_00 = 0; aperture_00 < *(int *)(in_RDI + 0x58); aperture_00 = aperture_00 + 1) {
    iVar5 = (int)((ulong)local_28 >> 0x20);
    iVar6 = std::__cxx11::list<imrt::Station_*,_std::allocator<imrt::Station_*>_>::begin
                      (in_stack_fffffffffffffe48);
    iVar2 = rand();
    this_00 = (Station *)(long)iVar2;
    std::__cxx11::list<imrt::Station_*,_std::allocator<imrt::Station_*>_>::size
              (in_stack_fffffffffffffe50);
    std::advance<std::_List_iterator<imrt::Station*>,unsigned_long>
              ((_List_iterator<imrt::Station_*> *)in_stack_fffffffffffffe70,
               (unsigned_long)in_stack_fffffffffffffe68);
    iVar2 = rand();
    if ((double)iVar2 / 2147483647.0 <= 0.3) {
      do {
        iVar5 = rand();
        std::_List_iterator<imrt::Station_*>::operator*((_List_iterator<imrt::Station_*> *)0x16d10d)
        ;
        iVar2 = Station::getNbBeamlets((Station *)0x16d115);
        std::_List_iterator<imrt::Station_*>::operator*((_List_iterator<imrt::Station_*> *)0x16d13a)
        ;
        bVar1 = Station::isActiveBeamlet
                          (in_stack_fffffffffffffe58,(int)((ulong)in_stack_fffffffffffffe50 >> 0x20)
                          );
        lside = (undefined1)((ulong)iVar6._M_node >> 0x38);
      } while (((bVar1 ^ 0xffU) & 1) != 0);
      iVar3 = rand();
      ppSVar7 = std::_List_iterator<imrt::Station_*>::operator*
                          ((_List_iterator<imrt::Station_*> *)0x16d16f);
      iVar4 = Station::getNbApertures(*ppSVar7);
      std::_List_iterator<imrt::Station_*>::operator*((_List_iterator<imrt::Station_*> *)0x16d19c);
      bVar1 = Station::isOpenBeamlet
                        (in_stack_fffffffffffffe58,(int)((ulong)in_stack_fffffffffffffe50 >> 0x20),
                         (int)in_stack_fffffffffffffe50);
      if (bVar1) {
        iVar9 = rand();
        if ((double)iVar9 / 2147483647.0 <= 0.5) {
          std::_List_iterator<imrt::Station_*>::operator*
                    ((_List_iterator<imrt::Station_*> *)0x16d249);
          Station::closeBeamlet_abi_cxx11_
                    (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,aperture_00,(bool)lside);
          std::__cxx11::list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
          operator=((list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                    in_stack_fffffffffffffe60,
                    (list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                    in_stack_fffffffffffffe58);
          std::__cxx11::list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
          ~list((list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)0x16d291);
        }
        else {
          std::_List_iterator<imrt::Station_*>::operator*
                    ((_List_iterator<imrt::Station_*> *)0x16d1f5);
          Station::closeBeamlet_abi_cxx11_
                    (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,aperture_00,(bool)lside);
          std::__cxx11::list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
          operator=((list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                    in_stack_fffffffffffffe60,
                    (list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                    in_stack_fffffffffffffe58);
          std::__cxx11::list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
          ~list((list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)0x16d23a);
        }
      }
      else {
        std::_List_iterator<imrt::Station_*>::operator*((_List_iterator<imrt::Station_*> *)0x16d2a0)
        ;
        Station::openBeamlet_abi_cxx11_
                  (in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,in_stack_ffffffffffffff70);
        std::__cxx11::list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
        operator=((list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                  in_stack_fffffffffffffe60,
                  (list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                  in_stack_fffffffffffffe58);
        std::__cxx11::list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::~list
                  ((list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                   0x16d2e2);
      }
      std::_List_iterator<imrt::Station_*>::operator*((_List_iterator<imrt::Station_*> *)0x16d2fc);
      local_50 = Plan::incremental_eval
                           (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
                            (list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                             *)in_stack_fffffffffffffe50);
      poVar8 = std::operator<<((ostream *)&std::cout,"(");
      ppSVar7 = std::_List_iterator<imrt::Station_*>::operator*
                          ((_List_iterator<imrt::Station_*> *)0x16d34f);
      iVar9 = Station::getAngle(*ppSVar7);
      in_stack_fffffffffffffe80 = (Station *)std::ostream::operator<<(poVar8,iVar9);
      poVar8 = std::operator<<((ostream *)in_stack_fffffffffffffe80,",");
      in_stack_fffffffffffffe70 = (ostream *)std::ostream::operator<<(poVar8,iVar3 % iVar4);
      in_stack_fffffffffffffe68 = std::operator<<(in_stack_fffffffffffffe70,",");
      in_stack_fffffffffffffe60 =
           (Plan *)std::ostream::operator<<(in_stack_fffffffffffffe68,iVar5 % iVar2);
      std::operator<<((ostream *)in_stack_fffffffffffffe60,") ");
    }
    else {
      iVar2 = rand();
      ppSVar7 = std::_List_iterator<imrt::Station_*>::operator*
                          ((_List_iterator<imrt::Station_*> *)0x16cef7);
      iVar3 = Station::getNbApertures(*ppSVar7);
      iVar9 = iVar2 % iVar3;
      iVar4 = rand();
      if ((double)iVar4 / 2147483647.0 <= 0.5) {
        std::_List_iterator<imrt::Station_*>::operator*((_List_iterator<imrt::Station_*> *)0x16cfae)
        ;
        Station::modifyIntensityAperture_abi_cxx11_(this_00,iVar5,(double)CONCAT44(iVar3,iVar2));
        std::__cxx11::list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
        operator=((list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                  in_stack_fffffffffffffe60,
                  (list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                  in_stack_fffffffffffffe58);
        std::__cxx11::list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::~list
                  ((list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                   0x16cff9);
      }
      else {
        std::_List_iterator<imrt::Station_*>::operator*((_List_iterator<imrt::Station_*> *)0x16cf50)
        ;
        Station::modifyIntensityAperture_abi_cxx11_(this_00,iVar5,(double)CONCAT44(iVar3,iVar2));
        std::__cxx11::list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
        operator=((list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                  in_stack_fffffffffffffe60,
                  (list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                  in_stack_fffffffffffffe58);
        std::__cxx11::list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::~list
                  ((list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                   0x16cf9f);
      }
      std::_List_iterator<imrt::Station_*>::operator*((_List_iterator<imrt::Station_*> *)0x16d016);
      local_50 = Plan::incremental_eval
                           (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
                            (list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                             *)in_stack_fffffffffffffe50);
      poVar8 = std::operator<<((ostream *)&std::cout,"(");
      ppSVar7 = std::_List_iterator<imrt::Station_*>::operator*
                          ((_List_iterator<imrt::Station_*> *)0x16d075);
      iVar5 = Station::getAngle(*ppSVar7);
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,iVar5);
      poVar8 = std::operator<<(poVar8,",");
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,iVar9);
      std::operator<<(poVar8,") ");
    }
    std::_List_iterator<imrt::Station_*>::operator*((_List_iterator<imrt::Station_*> *)0x16d3f4);
    Station::clearHistory(in_stack_fffffffffffffe80);
  }
  poVar8 = std::operator<<((ostream *)&std::cout,", new eval: ");
  this_01 = (void *)std::ostream::operator<<(poVar8,local_50);
  std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
  std::__cxx11::list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::~list
            ((list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)0x16d478);
  std::__cxx11::list<imrt::Station_*,_std::allocator<imrt::Station_*>_>::~list
            ((list<imrt::Station_*,_std::allocator<imrt::Station_*>_> *)0x16d485);
  return local_50;
}

Assistant:

double ApertureILS::perturbation(Plan& P) {
  list<Station*> stations = P.get_stations();
  int beamlet, aperture;
  list<pair<int,double>> diff;
  double aux_eval=P.getEvaluation();
  
  cout << "##  Perturbation: " ;
  if (perturbation_size==0) cout << "none";   
  else tabu.clear();
  for (int i=0; i<perturbation_size; i++) {
    list<Station*>::iterator s=stations.begin();
    std::advance(s,rand()%stations.size());
    if (((double) rand() / (RAND_MAX)) > 0.3) {
      //Modify intensity
      aperture = (rand()% (*s)->getNbApertures());
      if (((double) rand() / (RAND_MAX)) > 0.5){ 
        diff = (*s)->modifyIntensityAperture(aperture, -step_intensity);
      }else{ 
        diff = (*s)->modifyIntensityAperture(aperture, step_intensity);
      }
      aux_eval = P.incremental_eval(*(*s), diff);
      cout << "(" << (*s)->getAngle() << ","<< aperture<<") ";
    } else {
      //Modify aperture
      do { 
        beamlet = (rand()% (*s)->getNbBeamlets());
      } while (!(*s)->isActiveBeamlet(beamlet));
      aperture = (rand()% (*s)->getNbApertures());
      if ((*s)->isOpenBeamlet(beamlet, aperture)){
        if (((double) rand() / (RAND_MAX)) > 0.5) 
          diff = (*s)->closeBeamlet(beamlet, aperture, false);
        else
          diff = (*s)->closeBeamlet(beamlet, aperture, true);
      } else {
        diff = (*s)->openBeamlet(beamlet, aperture);
      }
      aux_eval = P.incremental_eval(*(*s), diff);
      cout << "(" << (*s)->getAngle() << "," << aperture<< "," << beamlet << ") ";
    }
    (*s)->clearHistory();
  }
  
  //aux_eval = P.eval();
  cout << ", new eval: "<< aux_eval<< endl;
  return(aux_eval);
}